

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_CreateDirectory_Test::TestBody
          (CommandLineInterfaceTest_CreateDirectory_Test *this)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view contents;
  string *local_f0;
  string *local_e8;
  undefined1 local_e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  undefined1 local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  name._M_str = "bar/baz/foo.proto";
  name._M_len = 0x11;
  contents._M_str = "syntax = \"proto2\";\nmessage Foo {}\n";
  contents._M_len = 0x22;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  name_00._M_str = "out";
  name_00._M_len = 3;
  CommandLineInterfaceTester::CreateTempDir((CommandLineInterfaceTester *)this,name_00);
  name_01._M_str = "plugout";
  name_01._M_len = 7;
  CommandLineInterfaceTester::CreateTempDir((CommandLineInterfaceTester *)this,name_01);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "protocol_compiler --test_out=$tmpdir/out --plug_out=$tmpdir/plugout --proto_path=$tmpdir bar/baz/foo.proto"
             ,"");
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  local_f0 = (string *)local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"test_generator","");
  local_d0._M_allocated_capacity = (size_type)(string *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_e0 + 0x10),anon_var_dwarf_a22956 + 5);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"bar/baz/foo.proto","");
  local_b0._M_allocated_capacity = (size_type)local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_c0 + 0x10),"Foo","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"out","");
  CommandLineInterfaceTest::ExpectGenerated
            ((CommandLineInterfaceTest *)
             (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.temp_directory_
             ._M_dataplus._M_p,
             (string *)
             (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.temp_directory_
             ._M_string_length,local_f0,local_e8,(string *)local_d0._M_allocated_capacity,
             (string *)local_d0._8_8_);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if ((long *)local_b0._M_allocated_capacity != local_a0) {
    operator_delete((void *)local_b0._M_allocated_capacity,local_a0[0] + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if ((string *)local_d0._M_allocated_capacity != (string *)local_c0) {
    operator_delete((void *)local_d0._M_allocated_capacity,(ulong)(local_c0._0_8_ + 1));
  }
  if (local_f0 != (string *)local_e0) {
    operator_delete(local_f0,(ulong)(local_e0._0_8_ + 1));
  }
  local_f0 = (string *)local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"test_plugin","");
  local_d0._M_allocated_capacity = (size_type)(string *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_e0 + 0x10),anon_var_dwarf_a22956 + 5);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"bar/baz/foo.proto","");
  local_b0._M_allocated_capacity = (size_type)local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_c0 + 0x10),"Foo","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"plugout","");
  CommandLineInterfaceTest::ExpectGenerated
            ((CommandLineInterfaceTest *)
             (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.temp_directory_
             ._M_dataplus._M_p,
             (string *)
             (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.temp_directory_
             ._M_string_length,local_f0,local_e8,(string *)local_d0._M_allocated_capacity,
             (string *)local_d0._8_8_);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if ((long *)local_b0._M_allocated_capacity != local_a0) {
    operator_delete((void *)local_b0._M_allocated_capacity,local_a0[0] + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if ((string *)local_d0._M_allocated_capacity != (string *)local_c0) {
    operator_delete((void *)local_d0._M_allocated_capacity,(ulong)(local_c0._0_8_ + 1));
  }
  if (local_f0 != (string *)local_e0) {
    operator_delete(local_f0,(ulong)(local_e0._0_8_ + 1));
  }
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, CreateDirectory) {
  // Test that when we output to a sub-directory, it is created.

  CreateTempFile("bar/baz/foo.proto",
                 "syntax = \"proto2\";\n"
                 "message Foo {}\n");
  CreateTempDir("out");
  CreateTempDir("plugout");

  Run("protocol_compiler --test_out=$tmpdir/out --plug_out=$tmpdir/plugout "
      "--proto_path=$tmpdir bar/baz/foo.proto");

  ExpectNoErrors();
  ExpectGenerated("test_generator", "", "bar/baz/foo.proto", "Foo", "out");
  ExpectGenerated("test_plugin", "", "bar/baz/foo.proto", "Foo", "plugout");
}